

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc-time.c
# Opt level: O2

uint64_t rtosc_float2secfracs(float secfracsf)

{
  char cVar1;
  ulong uVar2;
  ushort **ppuVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *__dest;
  char secfracs_as_hex [32];
  int exp;
  long local_30;
  
  snprintf(secfracs_as_hex,0x20,"%a",(double)secfracsf);
  uVar2 = (ulong)(secfracs_as_hex[0] == '-');
  if (secfracs_as_hex[uVar2 + 3] == '.') {
    __dest = secfracs_as_hex + uVar2 + 3;
    pcVar5 = secfracs_as_hex + uVar2 + 4;
    pcVar6 = (char *)0x0;
    while( true ) {
      cVar1 = *pcVar5;
      if ((long)cVar1 == 0) break;
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x10) == 0) break;
      if (cVar1 != '0') {
        pcVar6 = pcVar5;
      }
      pcVar5 = pcVar5 + 1;
    }
    if ((pcVar6 == (char *)0x0) || (__dest = pcVar6 + 1, pcVar5 != __dest)) {
      sVar4 = strlen(pcVar5);
      memmove(__dest,pcVar5,sVar4 + 1);
    }
  }
  if (secfracs_as_hex[3] == '.') {
    pcVar6 = secfracs_as_hex + 3;
    secfracs_as_hex[3] = secfracs_as_hex[2];
  }
  else {
    pcVar6 = secfracs_as_hex + 2;
  }
  pcVar5 = strstr(secfracs_as_hex,"+0");
  if ((pcVar5 == (char *)0x0) || (pcVar5[2] != '\0')) {
    __isoc99_sscanf(pcVar6,"%lxp-%i",&local_30,&exp);
  }
  else {
    local_30 = 0;
    exp._0_1_ = '\0';
  }
  pcVar5 = strchr(secfracs_as_hex,0x70);
  return local_30 << ((((char)pcVar6 - (char)pcVar5) * '\x04' - (char)exp) + 0x24U & 0x3f);
}

Assistant:

uint64_t rtosc_float2secfracs(float secfracsf)
{
    char secfracs_as_hex[32];
    // print float in hex representation (lossless)
    int written = snprintf(secfracs_as_hex, 32, "%a", secfracsf);
    // examples:
    // 0.85 => 0x1.b33334p-1
    // 0.51 => 0x1.051eb8p-1
    // 0.5  => 0x8p-4
    remove_trailing_zeroes(secfracs_as_hex);

    assert(written >= 0); // no error
    assert(written < (int)sizeof(secfracs_as_hex)); // size suffices
    (void) written;
    int scanpos;
    if(secfracs_as_hex[3]=='.') // 0x?.???
    {
        secfracs_as_hex[3] = secfracs_as_hex[2]; // remove '.'
        scanpos = 3;
    }
    else
    {
        scanpos = 2;
    }
    uint64_t secfracs;
    int exp;
    const char* plus;
    if((plus = strstr(secfracs_as_hex, "+0")) && !plus[2])
    {
        // exponent with plus sign, does not match the scanf below
        secfracs = exp = 0;
    }
    else
    {
        int scanned = sscanf(secfracs_as_hex + scanpos,
                             "%"PRIx64"p-%i" /* expands to like "%lxp-%i" */,
                             &secfracs, &exp);
#ifdef NDEBUG
        (void)scanned;
#else
        assert(scanned == 2);
#endif
    }
    const char* p = strchr(secfracs_as_hex, 'p');
    assert(p);
    int hexdigits_after_comma = p-(secfracs_as_hex+scanpos+1);

    /*
       Remember that
       (1) shifting a comma over one hex digits multiplies/divides by 4
       (2) that secfracsf was scanned as "%a"
       (3) 0x00000001 counts as one secfrac and 0x100000000 would equal 1,
           which means one secfrac is 2^-32
       Then, we get:
                      base_without_comma*2^(-exp-4*hexdigits_after_comma)
       (with (1))   = base_with_comma*2^-exp
       (with (2))   = secfracsf
       (with (3))   = secfracs*2^-32
       <=> secfracs = base_without_comma * 2^(32-exp-4*hexdigits_after_comma)
    */
    int lshift = 32-exp-(hexdigits_after_comma<<2);
    assert(lshift > 0);
    secfracs <<= lshift;
    assert((secfracs & 0xFFFFFFFF) == secfracs);

    return secfracs;
}